

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

void __thiscall VertexBuffer::VertexBuffer(VertexBuffer *this)

{
  (this->m_layout).elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layout).elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_layout).elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layout).stride = 0;
  (*glad_glGenBuffers)(1,&this->m_id);
  return;
}

Assistant:

VertexBuffer::VertexBuffer()
{
    init_buffer();
}